

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O1

void helper_gvec_fcaddh_aarch64(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  float16 fVar2;
  float16 fVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  uintptr_t i;
  ulong uVar6;
  
  uVar4 = desc * 8 & 0xff;
  uVar5 = uVar4 + 8;
  uVar6 = (ulong)uVar5;
  uVar9 = (ushort)(desc << 5) & 0x8000;
  uVar8 = 0;
  do {
    fVar3 = *(float16 *)((long)vn + uVar8 * 2 + 2);
    uVar1 = *(ushort *)((long)vm + uVar8 * 2);
    fVar2 = float16_add_aarch64(*(float16 *)((long)vn + uVar8 * 2),
                                *(ushort *)((long)vm + uVar8 * 2 + 2) ^ uVar9 ^ 0x8000,
                                (float_status *)vfpst);
    *(float16 *)((long)vd + uVar8 * 2) = fVar2;
    fVar3 = float16_add_aarch64(fVar3,uVar1 ^ uVar9,(float_status *)vfpst);
    *(float16 *)((long)vd + uVar8 * 2 + 2) = fVar3;
    uVar8 = uVar8 + 2;
  } while (uVar8 < uVar5 >> 1);
  uVar5 = desc >> 2 & 0xf8;
  if (uVar4 < uVar5) {
    uVar7 = (ulong)(uVar5 + 8);
    uVar8 = uVar6 + 8;
    if (uVar6 + 8 < uVar7) {
      uVar8 = uVar7;
    }
    memset((void *)((long)vd + uVar6),0,(~uVar6 + uVar8 & 0xfffffffffffffff8) + 8);
    return;
  }
  return;
}

Assistant:

void HELPER(gvec_fcaddh)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    uint32_t neg_real = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e0 = n[H2(i)];
        float16 e1 = m[H2(i + 1)] ^ neg_imag;
        float16 e2 = n[H2(i + 1)];
        float16 e3 = m[H2(i)] ^ neg_real;

        d[H2(i)] = float16_add(e0, e1, fpst);
        d[H2(i + 1)] = float16_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}